

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btNNCGConstraintSolver.cpp
# Opt level: O2

btScalar __thiscall
btNNCGConstraintSolver::solveGroupCacheFriendlySetup
          (btNNCGConstraintSolver *this,btCollisionObject **bodies,int numBodies,
          btPersistentManifold **manifoldPtr,int numManifolds,btTypedConstraint **constraints,
          int numConstraints,btContactSolverInfo *infoGlobal,btIDebugDraw *debugDrawer)

{
  btScalar bVar1;
  
  bVar1 = btSequentialImpulseConstraintSolver::solveGroupCacheFriendlySetup
                    (&this->super_btSequentialImpulseConstraintSolver,bodies,numBodies,manifoldPtr,
                     numManifolds,constraints,numConstraints,infoGlobal,debugDrawer);
  btAlignedObjectArray<float>::resizeNoInitialize
            (&this->m_pNC,
             (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverNonContactConstraintPool.
             m_size);
  btAlignedObjectArray<float>::resizeNoInitialize
            (&this->m_pC,
             (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverContactConstraintPool.
             m_size);
  btAlignedObjectArray<float>::resizeNoInitialize
            (&this->m_pCF,
             (this->super_btSequentialImpulseConstraintSolver).
             m_tmpSolverContactFrictionConstraintPool.m_size);
  btAlignedObjectArray<float>::resizeNoInitialize
            (&this->m_pCRF,
             (this->super_btSequentialImpulseConstraintSolver).
             m_tmpSolverContactRollingFrictionConstraintPool.m_size);
  btAlignedObjectArray<float>::resizeNoInitialize
            (&this->m_deltafNC,
             (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverNonContactConstraintPool.
             m_size);
  btAlignedObjectArray<float>::resizeNoInitialize
            (&this->m_deltafC,
             (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverContactConstraintPool.
             m_size);
  btAlignedObjectArray<float>::resizeNoInitialize
            (&this->m_deltafCF,
             (this->super_btSequentialImpulseConstraintSolver).
             m_tmpSolverContactFrictionConstraintPool.m_size);
  btAlignedObjectArray<float>::resizeNoInitialize
            (&this->m_deltafCRF,
             (this->super_btSequentialImpulseConstraintSolver).
             m_tmpSolverContactRollingFrictionConstraintPool.m_size);
  return bVar1;
}

Assistant:

btScalar btNNCGConstraintSolver::solveGroupCacheFriendlySetup(btCollisionObject** bodies,int numBodies,btPersistentManifold** manifoldPtr, int numManifolds,btTypedConstraint** constraints,int numConstraints,const btContactSolverInfo& infoGlobal,btIDebugDraw* debugDrawer)
{
	btScalar val = btSequentialImpulseConstraintSolver::solveGroupCacheFriendlySetup( bodies,numBodies,manifoldPtr, numManifolds, constraints,numConstraints,infoGlobal,debugDrawer);

	m_pNC.resizeNoInitialize(m_tmpSolverNonContactConstraintPool.size());
	m_pC.resizeNoInitialize(m_tmpSolverContactConstraintPool.size());
	m_pCF.resizeNoInitialize(m_tmpSolverContactFrictionConstraintPool.size());
	m_pCRF.resizeNoInitialize(m_tmpSolverContactRollingFrictionConstraintPool.size());

	m_deltafNC.resizeNoInitialize(m_tmpSolverNonContactConstraintPool.size());
	m_deltafC.resizeNoInitialize(m_tmpSolverContactConstraintPool.size());
	m_deltafCF.resizeNoInitialize(m_tmpSolverContactFrictionConstraintPool.size());
	m_deltafCRF.resizeNoInitialize(m_tmpSolverContactRollingFrictionConstraintPool.size());

	return val;
}